

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

size_t rcg::setRegister(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,uint8_t *buffer,
                       size_t len,bool exception)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  unsigned_long *puVar5;
  invalid_argument *piVar6;
  undefined8 in_RDX;
  char *in_RSI;
  byte in_R8B;
  GenericException *ex;
  IRegister *val;
  INode *node;
  size_t ret;
  IBase *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  long *local_1c0;
  allocator local_179;
  string local_178 [32];
  string local_158 [38];
  undefined1 local_132;
  allocator local_131;
  string local_130 [32];
  string local_110 [38];
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [32];
  unsigned_long local_a8;
  long *local_a0;
  gcstring local_88 [80];
  long local_38;
  unsigned_long local_30;
  byte local_21;
  unsigned_long local_20;
  undefined8 local_18;
  char *local_10;
  long lVar4;
  
  local_21 = in_R8B & 1;
  local_30 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  peVar3 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15c2ec);
  GenICam_3_4::gcstring::gcstring(local_88,local_10);
  iVar2 = (*(peVar3->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar3,local_88);
  lVar4 = CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring(local_88);
  local_38 = lVar4;
  if (lVar4 == 0) {
    if ((local_21 & 1) != 0) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"Feature not found: ",&local_179);
      std::operator+(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
      std::invalid_argument::invalid_argument(piVar6,local_158);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    bVar1 = GenApi_3_4::IsWritable(in_stack_fffffffffffffdf0);
    if (bVar1) {
      if (local_38 == 0) {
        local_1c0 = (long *)0x0;
      }
      else {
        local_1c0 = (long *)__dynamic_cast(local_38,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IRegister::typeinfo,0xfffffffffffffffe);
      }
      local_a0 = local_1c0;
      if (local_1c0 == (long *)0x0) {
        if ((local_21 & 1) != 0) {
          local_ea = 1;
          piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e8,"Feature not of type register: ",&local_e9);
          std::operator+(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
          std::invalid_argument::invalid_argument(piVar6,local_c8);
          local_ea = 0;
          __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        local_a8 = (**(code **)(*local_1c0 + 0x48))(local_1c0,0);
        puVar5 = std::min<unsigned_long>(&local_20,&local_a8);
        local_20 = *puVar5;
        (**(code **)(*local_a0 + 0x38))(local_a0,local_18,local_20,1);
        local_30 = local_20;
      }
    }
    else if ((local_21 & 1) != 0) {
      local_132 = 1;
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,"Feature not writable: ",&local_131);
      std::operator+(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
      std::invalid_argument::invalid_argument(piVar6,local_110);
      local_132 = 0;
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return local_30;
}

Assistant:

size_t setRegister(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
  const uint8_t *buffer, size_t len, bool exception)
{
  size_t ret=0;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsWritable(node))
      {
        GenApi::IRegister *val=dynamic_cast<GenApi::IRegister *>(node);

        if (val != 0)
        {
          len=std::min(len, static_cast<size_t>(val->GetLength()));
          val->Set(buffer, len);
          ret=len;
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not of type register: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not writable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}